

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O0

SUNErrCode SUNAdaptController_Write(SUNAdaptController C,FILE *fptr)

{
  undefined8 in_RSI;
  long in_RDI;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_1c = 0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 8) + 0x30) != 0) {
      local_1c = (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI,in_RSI);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdaptController_Write(SUNAdaptController C, FILE* fptr)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  if (C->ops->write) { ier = C->ops->write(C, fptr); }
  return (ier);
}